

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrf.c
# Opt level: O2

void cgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  uint n;
  int iVar1;
  int_t *piVar2;
  int_t *piVar3;
  superlu_options_t *psVar4;
  int iVar5;
  int_t iVar6;
  int_t iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int_t *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  ulong uVar19;
  int nseg;
  uint local_17c;
  superlu_options_t *local_178;
  int *local_170;
  ulong local_168;
  int *repfnz;
  int *segrep;
  fact_t local_150;
  int nseg1;
  ulong local_148;
  int_t *xprune;
  int *local_138;
  singlecomplex *dense;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  int *local_108;
  ulong local_100;
  int *local_f8;
  long local_f0;
  int_t *local_e8;
  singlecomplex *tempv;
  int_t *xplore;
  int_t *local_d0;
  long local_c8;
  int_t *local_c0;
  int_t *local_b8;
  int *local_b0;
  int *local_a8;
  SuperMatrix *local_a0;
  int *local_98;
  int_t *local_90;
  double local_88;
  int *panel_lsub;
  int *parent;
  singlecomplex *cwork;
  int *iwork;
  long local_60;
  int_t *local_58;
  flops_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_168 = CONCAT44(local_168._4_4_,relax);
  local_170 = etree;
  iVar5 = sp_ienv(6);
  local_150 = options->Fact;
  local_88 = options->DiagPivotThresh;
  local_98 = stat->panel_histo;
  local_50 = stat->ops;
  uVar8 = A->nrow;
  local_148 = (ulong)uVar8;
  n = A->ncol;
  local_17c = n;
  if ((int)uVar8 < (int)n) {
    local_17c = uVar8;
  }
  piVar11 = (int_t *)A->Store;
  lVar13 = *(long *)(piVar11 + 2);
  piVar2 = *(int_t **)(piVar11 + 4);
  local_90 = *(int_t **)(piVar11 + 6);
  piVar3 = *(int_t **)(piVar11 + 8);
  local_100 = (ulong)(uint)panel_size;
  local_a0 = A;
  iVar6 = cLUMemInit(local_150,work,lwork,uVar8,n,*piVar11,panel_size,(float)iVar5,L,U,Glu,&iwork,
                     &cwork);
  uVar14 = local_148;
  *info = iVar6;
  if (iVar6 == 0) {
    local_a8 = Glu->xsup;
    local_b0 = Glu->supno;
    local_b8 = Glu->xlsub;
    local_c0 = Glu->xlusup;
    local_e8 = Glu->xusub;
    iVar5 = (int)local_148;
    iVar15 = (int)local_100;
    local_178 = options;
    SetIWork(iVar5,n,iVar15,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
    cSetRWork(iVar5,iVar15,cwork,&dense,&tempv);
    uVar19 = 0;
    usepr = (int)(local_150 == SamePattern_SameRowPerm);
    if (local_150 == SamePattern_SameRowPerm) {
      local_138 = int32Malloc(iVar5);
      uVar10 = 0;
      if (0 < iVar5) {
        uVar10 = uVar14 & 0xffffffff;
      }
      for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
        local_138[perm_r[uVar14]] = (int)uVar14;
      }
    }
    else {
      local_138 = (int *)0x0;
    }
    local_c8 = (long)iVar5;
    local_60 = (long)(int)n;
    local_108 = int32Malloc(n);
    uVar14 = 0;
    if (0 < (int)n) {
      uVar14 = (ulong)n;
    }
    for (; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      local_108[perm_c[uVar19]] = (int)uVar19;
    }
    piVar11 = intMalloc(n);
    if (local_178->SymmetricMode == YES) {
      heap_relax_snode(n,local_170,(int)local_168,marker,piVar11);
    }
    else {
      relax_snode(n,local_170,(int)local_168,marker,piVar11);
    }
    iVar5 = (int)local_148;
    ifill(perm_r,iVar5,-1);
    ifill(marker,iVar5 * 3,-1);
    *local_b0 = -1;
    *local_c0 = 0;
    *local_e8 = 0;
    *local_b8 = 0;
    *local_a8 = 0;
    local_58 = piVar11 + 1;
    local_40 = local_c8 * 4;
    local_48 = local_c8 * 8;
    local_168 = 0;
    piVar18 = (int *)0x0;
    local_d0 = piVar11;
    while( true ) {
      piVar11 = local_d0;
      uVar8 = local_17c;
      iVar15 = (int)piVar18;
      iVar5 = (int)local_148;
      if ((int)local_17c <= iVar15) break;
      local_170 = (int *)((ulong)piVar18 & 0xffffffff);
      piVar17 = (int *)(long)iVar15;
      iVar16 = local_d0[(long)piVar17];
      if ((superlu_options_t *)(long)iVar16 == (superlu_options_t *)0xffffffffffffffff) {
        uVar8 = (int)local_100 + iVar15;
        if ((int)local_17c <= (int)uVar8) {
          uVar8 = local_17c;
        }
        uVar14 = 0;
        do {
          if ((long)(int)uVar8 <= (long)((long)piVar17 + uVar14 + 1)) {
            uVar8 = (int)uVar14 + iVar15 + 1;
            uVar19 = local_100;
            goto LAB_00105be0;
          }
          uVar19 = uVar14 + 1;
          lVar12 = (long)piVar17 + uVar14;
          uVar14 = uVar19;
        } while (local_58[lVar12] == -1);
        uVar8 = iVar15 + (int)uVar19;
LAB_00105be0:
        iVar16 = local_17c - iVar15;
        if (uVar8 != local_17c) {
          iVar16 = (int)uVar19;
        }
        local_98[iVar16] = local_98[iVar16] + 1;
        cpanel_dfs(iVar5,iVar16,iVar15,local_a0,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,xprune,
                   marker,parent,xplore,Glu);
        iVar5 = (int)local_170;
        cpanel_bmod((int)local_148,iVar16,iVar5,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar8 = iVar16 + iVar5;
        local_f8 = (int *)(ulong)uVar8;
        local_f0 = (long)(int)uVar8;
        local_178 = (superlu_options_t *)0x0;
        lVar12 = 0;
        for (; piVar18 = local_f8, (long)piVar17 < local_f0; piVar17 = (int *)((long)piVar17 + 1)) {
          nseg = nseg1;
          iVar15 = (int)piVar17;
          iVar5 = ccolumn_dfs((int)local_148,iVar15,perm_r,&nseg,(int *)((long)panel_lsub + lVar12),
                              segrep,(int *)((long)repfnz + lVar12),xprune,marker,parent,xplore,Glu)
          ;
          psVar4 = local_178;
          *info = iVar5;
          if (iVar5 != 0) {
            return;
          }
          iVar5 = ccolumn_bmod(iVar15,nseg - nseg1,
                               (singlecomplex *)((long)&local_178->Fact + (long)&dense->r),tempv,
                               segrep + nseg1,(int *)((long)repfnz + lVar12),(int)local_170,Glu,stat
                              );
          *info = iVar5;
          if (iVar5 != 0) {
            return;
          }
          iVar5 = ccopy_to_ucol(iVar15,nseg,segrep,(int *)((long)repfnz + lVar12),perm_r,
                                (singlecomplex *)((long)&psVar4->Fact + (long)&dense->r),Glu);
          *info = iVar5;
          if (iVar5 != 0) {
            return;
          }
          local_178 = psVar4;
          uVar9 = cpivotL(iVar15,local_88,&usepr,perm_r,local_138,local_108,&pivrow,Glu,stat);
          *info = uVar9;
          uVar8 = (uint)local_168;
          if ((uint)local_168 == 0) {
            uVar8 = uVar9;
          }
          local_168 = local_168 & 0xffffffff;
          if (uVar9 != 0) {
            local_168 = (ulong)uVar8;
          }
          cpruneL(iVar15,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar12),xprune,Glu);
          resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar12));
          lVar12 = lVar12 + local_40;
          local_178 = (superlu_options_t *)((long)&local_178->Fact + local_48);
        }
      }
      else {
        local_98[(long)(iVar16 - iVar15) + 1] = local_98[(long)(iVar16 - iVar15) + 1] + 1;
        local_178 = (superlu_options_t *)(long)iVar16;
        iVar6 = csnode_dfs(iVar15,iVar16,piVar2,local_90,piVar3,xprune,marker,Glu);
        *info = iVar6;
        if (iVar6 != 0) {
          return;
        }
        local_f0 = CONCAT44(local_f0._4_4_,local_e8[(long)piVar17]);
        iVar6 = local_c0[(long)piVar17];
        local_f8 = (int *)(long)local_b0[(long)piVar17];
        local_38 = (long)local_a8[(long)local_f8];
        iVar5 = local_b8[local_38 + 1];
        iVar1 = local_b8[local_38];
        nzlumax = Glu->nzlumax;
        while (piVar18 = piVar17, nzlumax < (iVar5 - iVar1) * ((iVar16 - iVar15) + 1) + iVar6) {
          iVar7 = cLUMemXpand((int)local_170,iVar6,LUSUP,&nzlumax,Glu);
          *info = iVar7;
          if (iVar7 != 0) {
            return;
          }
        }
        while ((long)piVar18 <= (long)local_178) {
          local_170 = (int *)((long)piVar18 + 1);
          local_e8[(long)piVar18 + 1] = (int_t)local_f0;
          for (lVar12 = (long)local_90[(long)piVar18]; lVar12 < piVar3[(long)piVar18];
              lVar12 = lVar12 + 1) {
            dense[piVar2[lVar12]] = *(singlecomplex *)(lVar13 + lVar12 * 8);
          }
          csnode_bmod((int)piVar18,(int)local_f8,(int)local_38,dense,tempv,Glu,stat);
          uVar8 = cpivotL((int)piVar18,local_88,&usepr,perm_r,local_138,local_108,&pivrow,Glu,stat);
          *info = uVar8;
          uVar14 = local_168 & 0xffffffff;
          if ((int)local_168 == 0) {
            uVar14 = (ulong)uVar8;
          }
          piVar18 = local_170;
          local_168 = local_168 & 0xffffffff;
          if (uVar8 != 0) {
            local_168 = uVar14;
          }
        }
      }
    }
    iVar15 = (int)local_168;
    *info = iVar15;
    uVar9 = iVar15 - 1;
    if (iVar15 == 0) {
      uVar9 = n;
    }
    if ((int)uVar9 < iVar5) {
      lVar13 = 0;
      while ((lVar13 < local_c8 && ((int)uVar9 < iVar5))) {
        if (perm_r[lVar13] == -1) {
          perm_r[lVar13] = uVar9;
          uVar9 = uVar9 + 1;
        }
        lVar13 = lVar13 + 1;
      }
    }
    countnz(local_17c,xprune,&nnzL,&nnzU,Glu);
    fixupL(uVar8,perm_r,Glu);
    cLUWorkFree(iwork,cwork,Glu);
    superlu_free(xplore);
    superlu_free(xprune);
    if (local_150 == SamePattern_SameRowPerm) {
      piVar2 = (int_t *)L->Store;
      *piVar2 = nnzL;
      piVar2[1] = Glu->supno[local_60];
      piVar3 = Glu->xlusup;
      *(void **)(piVar2 + 2) = Glu->lusup;
      *(int_t **)(piVar2 + 4) = piVar3;
      piVar3 = Glu->xlsub;
      *(int_t **)(piVar2 + 6) = Glu->lsub;
      *(int_t **)(piVar2 + 8) = piVar3;
      piVar2 = (int_t *)U->Store;
      *piVar2 = nnzU;
      piVar3 = Glu->usub;
      *(void **)(piVar2 + 2) = Glu->ucol;
      *(int_t **)(piVar2 + 4) = piVar3;
      *(int_t **)(piVar2 + 6) = Glu->xusub;
    }
    else {
      cCreate_SuperNode_Matrix
                (L,local_a0->nrow,uVar8,nnzL,(singlecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
                 Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_C,SLU_TRLU);
      cCreate_CompCol_Matrix
                (U,uVar8,uVar8,nnzU,(singlecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_C,
                 SLU_TRU);
    }
    piVar18 = local_108;
    local_50[7] = local_50[0x13] + local_50[0x14] + local_50[7];
    iVar5 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar5;
    stat->expansions = iVar5;
    if (local_150 == SamePattern_SameRowPerm) {
      superlu_free(local_138);
    }
    superlu_free(piVar18);
    superlu_free(piVar11);
  }
  return;
}

Assistant:

void
cgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    singlecomplex    *cwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    singlecomplex    *dense, *tempv;
    int       *relax_end;
    singlecomplex    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    float fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = cLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &cwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    cSetRWork(m, panel_size, cwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = csnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        csnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = cpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		cprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    cpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    cpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = ccolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = ccolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = ccopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = cpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	cpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		cprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    cLUWorkFree(iwork, cwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (singlecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (singlecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        cCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (singlecomplex *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_C, SLU_TRLU);
    	cCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (singlecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_C, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}